

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::update_style(Application *this)

{
  Camera *in_RDI;
  float fVar1;
  double dVar2;
  float scale_factor;
  float view_distance;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  
  Camera::position(in_RDI);
  Camera::view_point(in_RDI);
  Vector3D::operator-((Vector3D *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      (Vector3D *)in_RDI);
  dVar2 = Vector3D::norm((Vector3D *)0x177e19);
  fVar1 = (float)(*(double *)(in_RDI + 0x2c0) / (double)(float)dVar2);
  *(float *)(in_RDI + 0x338) = fVar1 * 2.0;
  *(float *)(in_RDI + 0x370) = fVar1 * 2.0;
  *(float *)(in_RDI + 0x33c) = fVar1 * 8.0;
  *(float *)(in_RDI + 0x374) = fVar1 * 8.0;
  return;
}

Assistant:

void Application::update_style() {

  float view_distance = (camera.position() - camera.view_point()).norm();
  float scale_factor = canonical_view_distance / view_distance;

    hoverStyle.strokeWidth = 2.0 * scale_factor;
   selectStyle.strokeWidth = 2.0 * scale_factor;

    hoverStyle.vertexRadius = 8.0 * scale_factor;
   selectStyle.vertexRadius = 8.0 * scale_factor;
}